

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  int iVar1;
  xmlXIncludeDoc *pxVar2;
  xmlXIncludeTxt *pxVar3;
  long lVar4;
  long lVar5;
  
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    pxVar2 = ctxt->urlTab;
    if (pxVar2 != (xmlXIncludeDoc *)0x0) {
      if (0 < ctxt->urlNr) {
        lVar5 = 0;
        lVar4 = 0;
        do {
          xmlFreeDoc(*(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar5));
          (*xmlFree)(*(void **)((long)&ctxt->urlTab->url + lVar5));
          lVar4 = lVar4 + 1;
          lVar5 = lVar5 + 0x18;
        } while (lVar4 < ctxt->urlNr);
        pxVar2 = ctxt->urlTab;
      }
      (*xmlFree)(pxVar2);
    }
    iVar1 = ctxt->incNr;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        if (ctxt->incTab[lVar4] != (xmlXIncludeRefPtr)0x0) {
          xmlXIncludeFreeRef(ctxt->incTab[lVar4]);
          iVar1 = ctxt->incNr;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar1);
    }
    if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
      (*xmlFree)(ctxt->incTab);
    }
    pxVar3 = ctxt->txtTab;
    if (pxVar3 != (xmlXIncludeTxt *)0x0) {
      if (0 < ctxt->txtNr) {
        lVar5 = 0;
        lVar4 = 0;
        do {
          (*xmlFree)(*(void **)((long)&ctxt->txtTab->text + lVar5));
          (*xmlFree)(*(void **)((long)&ctxt->txtTab->url + lVar5));
          lVar4 = lVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar4 < ctxt->txtNr);
        pxVar3 = ctxt->txtTab;
      }
      (*xmlFree)(pxVar3);
    }
    if (ctxt->xpctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xpctxt);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

    if (ctxt == NULL)
	return;
    if (ctxt->urlTab != NULL) {
	for (i = 0; i < ctxt->urlNr; i++) {
	    xmlFreeDoc(ctxt->urlTab[i].doc);
	    xmlFree(ctxt->urlTab[i].url);
	}
	xmlFree(ctxt->urlTab);
    }
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    xmlFree(ctxt->txtTab[i].text);
	    xmlFree(ctxt->txtTab[i].url);
	}
	xmlFree(ctxt->txtTab);
    }
#ifdef LIBXML_XPTR_ENABLED
    if (ctxt->xpctxt != NULL)
	xmlXPathFreeContext(ctxt->xpctxt);
#endif
    xmlFree(ctxt);
}